

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  LogMessage *pLVar1;
  Rep *pRVar2;
  int iVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c1);
    pLVar1 = LogMessage::operator<<(&local_48,"CHECK failed: GetArena() == nullptr: ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,"ReleaseCleared() can only be used on a RepeatedPtrField not on ");
    pLVar1 = LogMessage::operator<<(pLVar1,"an arena.");
    LogFinisher::operator=(&local_49,pLVar1);
    LogMessage::~LogMessage(&local_48);
    if (this->arena_ != (Arena *)0x0) {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x4c4);
      pLVar1 = LogMessage::operator<<(&local_48,"CHECK failed: GetArena() == nullptr: ");
      LogFinisher::operator=(&local_49,pLVar1);
      LogMessage::~LogMessage(&local_48);
    }
  }
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c5);
    pLVar1 = LogMessage::operator<<(&local_48,"CHECK failed: rep_ != nullptr: ");
    LogFinisher::operator=(&local_49,pLVar1);
    LogMessage::~LogMessage(&local_48);
    pRVar2 = this->rep_;
  }
  iVar3 = pRVar2->allocated_size;
  if (iVar3 <= this->current_size_) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c6);
    pLVar1 = LogMessage::operator<<
                       (&local_48,"CHECK failed: (rep_->allocated_size) > (current_size_): ");
    LogFinisher::operator=(&local_49,pLVar1);
    LogMessage::~LogMessage(&local_48);
    pRVar2 = this->rep_;
    iVar3 = pRVar2->allocated_size;
  }
  pRVar2->allocated_size = iVar3 + -1;
  return (Type *)pRVar2->elements[(long)iVar3 + -1];
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseCleared() {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseCleared() can only be used on a RepeatedPtrField not on "
      << "an arena.";
  GOOGLE_DCHECK(GetArena() == nullptr);
  GOOGLE_DCHECK(rep_ != nullptr);
  GOOGLE_DCHECK_GT(rep_->allocated_size, current_size_);
  return cast<TypeHandler>(rep_->elements[--rep_->allocated_size]);
}